

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O0

Dim * __thiscall
cnn::AffineTransform::dim_forward
          (AffineTransform *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  uint uVar1;
  uint uVar2;
  size_type sVar3;
  invalid_argument *piVar4;
  const_reference pvVar5;
  ulong uVar6;
  uint *puVar7;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_RDX;
  Dim *in_RDI;
  ostringstream s_1;
  uint i;
  ostringstream s;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_stack_fffffffffffffc48;
  ostream *in_stack_fffffffffffffc50;
  ostringstream *this_00;
  string local_358 [32];
  ostringstream local_338 [376];
  uint local_1c0;
  undefined1 local_1b9;
  string local_1b8 [48];
  ostringstream local_188 [376];
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *local_10;
  
  local_10 = in_RDX;
  sVar3 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::size(in_RDX);
  if ((sVar3 - 1 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_188);
    std::operator<<((ostream *)local_188,"Bad number of inputs in AffineTransform: ");
    cnn::operator<<(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    local_1b9 = 1;
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::invalid_argument::invalid_argument(piVar4,local_1b8);
    local_1b9 = 0;
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pvVar5 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,0);
  memcpy(in_RDI,pvVar5,0x24);
  local_1c0 = 1;
  while( true ) {
    uVar6 = (ulong)local_1c0;
    sVar3 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::size(local_10);
    if (sVar3 <= uVar6) {
      return in_RDI;
    }
    pvVar5 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,(ulong)local_1c0)
    ;
    uVar1 = Dim::cols(pvVar5);
    pvVar5 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[]
                       (local_10,(ulong)(local_1c0 + 1));
    uVar2 = Dim::rows(pvVar5);
    if (uVar1 != uVar2) break;
    pvVar5 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,0);
    uVar1 = Dim::rows(pvVar5);
    pvVar5 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,(ulong)local_1c0)
    ;
    uVar2 = Dim::rows(pvVar5);
    if (uVar1 != uVar2) break;
    pvVar5 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,0);
    uVar1 = Dim::cols(pvVar5);
    pvVar5 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[]
                       (local_10,(ulong)(local_1c0 + 1));
    uVar2 = Dim::cols(pvVar5);
    if (uVar1 != uVar2) break;
    pvVar5 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,(ulong)local_1c0)
    ;
    puVar7 = std::max<unsigned_int>(&in_RDI->bd,&pvVar5->bd);
    pvVar5 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[]
                       (local_10,(ulong)(local_1c0 + 1));
    puVar7 = std::max<unsigned_int>(puVar7,&pvVar5->bd);
    in_RDI->bd = *puVar7;
    local_1c0 = local_1c0 + 2;
  }
  this_00 = local_338;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"Bad dimensions for AffineTransform: ");
  cnn::operator<<((ostream *)this_00,in_stack_fffffffffffffc48);
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::invalid_argument::invalid_argument(piVar4,local_358);
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim AffineTransform::dim_forward(const vector<Dim>& xs) const {
  if ((xs.size() - 1) % 2 != 0) {
    ostringstream s; s << "Bad number of inputs in AffineTransform: " << xs;
    throw std::invalid_argument(s.str());
  }
  Dim d = xs[0];
  for (unsigned i = 1; i < xs.size(); i += 2) {
    if (xs[i].cols() != xs[i+1].rows() ||
        xs[0].rows() != xs[i].rows() ||
        xs[0].cols() != xs[i+1].cols()) {
      ostringstream s; s << "Bad dimensions for AffineTransform: " << xs;
      throw std::invalid_argument(s.str());
    }
    d.bd = max(max(d.bd, xs[i].bd), xs[i+1].bd);
  }
  return d;
}